

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNdr.c
# Opt level: O1

Wln_Ntk_t * Wln_NtkFromNdr(void *pData)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  Hash_IntMan_t *pHVar4;
  Wln_Vec_t *pWVar5;
  uint uVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  uint *puVar9;
  void *pvVar10;
  Wln_Ntk_t *pWVar11;
  int *piVar12;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar13;
  long lVar14;
  Abc_Nam_t *pAVar15;
  Wln_Ntk_t *pWVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar22;
  long lVar23;
  ulong uVar24;
  int Ent_1;
  int iVar25;
  uint uVar26;
  int iVar27;
  long lVar28;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar29;
  int iVar30;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar31;
  int Ent_2;
  int iVar32;
  int Ent_3;
  long lVar33;
  int Ent;
  int *piVar34;
  ulong uVar35;
  bool bVar36;
  bool bVar37;
  int fFound;
  int End;
  int local_ac;
  Wln_Ntk_t *local_a8;
  uint local_9c;
  uint local_98;
  int local_94;
  uint *local_90;
  int local_84;
  ulong local_80;
  Vec_Int_t *local_78;
  int local_6c;
  int local_68;
  int local_64;
  long local_60;
  int local_58 [6];
  Vec_Int_t *local_40;
  ulong local_38;
  
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(400);
  pVVar7->pArray = piVar8;
  local_78 = pVVar7;
  puVar9 = (uint *)malloc(0x10);
  puVar9[0] = 100;
  puVar9[1] = 0;
  pvVar10 = malloc(800);
  *(void **)(puVar9 + 2) = pvVar10;
  iVar17 = *(int *)(*(long *)((long)pData + 0x10) + 8) + 2;
  iVar25 = 0;
  if (3 < iVar17) {
    iVar27 = 3;
    iVar25 = 0;
    do {
      bVar1 = *(byte *)(*(long *)((long)pData + 8) + (long)iVar27);
      if (bVar1 == 0) goto LAB_0035f260;
      iVar19 = 1;
      if (bVar1 < 4) {
        iVar19 = *(int *)(*(long *)((long)pData + 0x10) + (long)iVar27 * 4);
      }
      iVar25 = iVar25 + (uint)(bVar1 == 3);
      iVar27 = iVar27 + iVar19;
    } while (iVar27 < iVar17);
  }
  pWVar11 = Wln_NtkAlloc("top",iVar25);
  Wln_NtkCheckIntegrity(pData);
  uVar21 = (pWVar11->vTypes).nCap;
  if ((pWVar11->vNameIds).nCap < (int)uVar21) {
    piVar8 = (pWVar11->vNameIds).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc((long)(int)uVar21 << 2);
    }
    else {
      piVar8 = (int *)realloc(piVar8,(long)(int)uVar21 << 2);
    }
    (pWVar11->vNameIds).pArray = piVar8;
    if (piVar8 == (int *)0x0) goto LAB_0035f339;
    (pWVar11->vNameIds).nCap = uVar21;
  }
  if (0 < (int)uVar21) {
    memset((pWVar11->vNameIds).pArray,0,(ulong)uVar21 * 4);
  }
  (pWVar11->vNameIds).nSize = uVar21;
  uVar21 = (pWVar11->vTypes).nCap;
  if ((pWVar11->vInstIds).nCap < (int)uVar21) {
    piVar8 = (pWVar11->vInstIds).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc((long)(int)uVar21 << 2);
    }
    else {
      piVar8 = (int *)realloc(piVar8,(long)(int)uVar21 << 2);
    }
    (pWVar11->vInstIds).pArray = piVar8;
    if (piVar8 == (int *)0x0) goto LAB_0035f339;
    (pWVar11->vInstIds).nCap = uVar21;
  }
  local_90 = puVar9;
  if (0 < (int)uVar21) {
    memset((pWVar11->vInstIds).pArray,0,(ulong)uVar21 * 4);
  }
  (pWVar11->vInstIds).nSize = uVar21;
  lVar14 = *(long *)((long)pData + 0x10);
  local_a8 = pWVar11;
  if (3 < *(int *)(lVar14 + 8) + 2) {
    iVar17 = 3;
    do {
      lVar23 = (long)iVar17;
      cVar2 = *(char *)(*(long *)((long)pData + 8) + lVar23);
      if (cVar2 == '\x03') {
        iVar25 = iVar17 + 1;
        for (iVar27 = iVar25; iVar27 < *(int *)(lVar14 + lVar23 * 4) + iVar17;
            iVar27 = iVar27 + iVar19) {
          lVar33 = (long)iVar27;
          bVar1 = *(byte *)(*(long *)((long)pData + 8) + lVar33);
          if (bVar1 == 6) {
            if (*(int *)(lVar14 + lVar33 * 4) != 3) goto LAB_0035e4cd;
            break;
          }
          if (bVar1 == 0) goto LAB_0035f260;
          iVar19 = 1;
          if (bVar1 < 4) {
            iVar19 = *(int *)(lVar14 + lVar33 * 4);
          }
        }
        iVar27 = Ndr_ObjGetRange((Ndr_Data_t *)pData,iVar17,local_58,&local_ac);
        uVar21 = Wln_ObjAlloc(local_a8,3,iVar27,local_58[0],local_ac);
        lVar14 = *(long *)((long)pData + 0x10);
        iVar30 = *(int *)(lVar14 + lVar23 * 4) + iVar17;
        iVar19 = -1;
        iVar27 = -1;
        if (iVar25 < iVar30) {
          iVar27 = iVar25;
          do {
            lVar33 = (long)iVar27;
            bVar1 = *(byte *)(*(long *)((long)pData + 8) + lVar33);
            if (bVar1 == 5) {
              iVar27 = *(int *)(lVar14 + lVar33 * 4);
              goto LAB_0035e450;
            }
            if (bVar1 == 0) goto LAB_0035f260;
            iVar32 = 1;
            if (bVar1 < 4) {
              iVar32 = *(int *)(lVar14 + lVar33 * 4);
            }
            iVar27 = iVar27 + iVar32;
          } while (iVar27 < iVar30);
          iVar27 = -1;
        }
LAB_0035e450:
        if (iVar25 < iVar30) {
          do {
            lVar33 = (long)iVar25;
            bVar1 = *(byte *)(*(long *)((long)pData + 8) + lVar33);
            if (bVar1 == 7) {
              iVar19 = *(int *)(lVar14 + lVar33 * 4);
              break;
            }
            if (bVar1 == 0) goto LAB_0035f260;
            iVar32 = 1;
            if (bVar1 < 4) {
              iVar32 = *(int *)(lVar14 + lVar33 * 4);
            }
            iVar25 = iVar25 + iVar32;
          } while (iVar25 < iVar30);
        }
        if (((int)uVar21 < 0) || ((local_a8->vNameIds).nSize <= (int)uVar21)) goto LAB_0035f29e;
        (local_a8->vNameIds).pArray[uVar21] = iVar27;
        if (0 < iVar19) {
          if ((local_a8->vInstIds).nSize <= (int)uVar21) goto LAB_0035f29e;
          (local_a8->vInstIds).pArray[uVar21] = iVar19;
        }
      }
      else if (cVar2 == '\0') goto LAB_0035f260;
LAB_0035e4cd:
      bVar1 = *(byte *)(*(long *)((long)pData + 8) + lVar23);
      if (bVar1 == 0) goto LAB_0035f260;
      iVar25 = 1;
      if (bVar1 < 4) {
        iVar25 = *(int *)(*(long *)((long)pData + 0x10) + lVar23 * 4);
      }
      iVar17 = iVar17 + iVar25;
      lVar14 = *(long *)((long)pData + 0x10);
    } while (iVar17 < *(int *)(lVar14 + 8) + 2);
  }
  lVar14 = *(long *)((long)pData + 0x10);
  pWVar11 = local_a8;
  if (3 < *(int *)(lVar14 + 8) + 2) {
    iVar17 = 3;
LAB_0035e522:
    lVar23 = *(long *)((long)pData + 8);
    lVar33 = (long)iVar17;
    if (*(char *)(lVar23 + lVar33) != '\x03') {
      if (*(char *)(lVar23 + lVar33) != '\0') goto LAB_0035ec38;
      goto LAB_0035f260;
    }
    iVar25 = *(int *)(lVar14 + lVar33 * 4) + iVar17;
    uVar21 = iVar17 + 1;
    for (uVar26 = uVar21; (int)uVar26 < iVar25; uVar26 = uVar26 + iVar27) {
      lVar28 = (long)(int)uVar26;
      bVar1 = *(byte *)(lVar23 + lVar28);
      if (bVar1 == 6) {
        if (((int)uVar21 < iVar25) && (uVar26 = uVar21, *(int *)(lVar14 + lVar28 * 4) != 3))
        goto LAB_0035e5a1;
        break;
      }
      if (bVar1 == 0) goto LAB_0035f260;
      iVar27 = 1;
      if (bVar1 < 4) {
        iVar27 = *(int *)(lVar14 + lVar28 * 4);
      }
    }
    goto LAB_0035ec38;
  }
LAB_0035ec80:
  lVar14 = *(long *)((long)pData + 0x10);
  if (3 < *(int *)(lVar14 + 8) + 2) {
    iVar17 = 3;
    do {
      lVar23 = (long)iVar17;
      cVar2 = *(char *)(*(long *)((long)pData + 8) + lVar23);
      if (cVar2 == '\x03') {
        iVar25 = iVar17 + 1;
        for (iVar27 = iVar25; iVar27 < *(int *)(lVar14 + lVar23 * 4) + iVar17;
            iVar27 = iVar27 + iVar19) {
          lVar33 = (long)iVar27;
          bVar1 = *(byte *)(*(long *)((long)pData + 8) + lVar33);
          if (bVar1 == 6) {
            if (*(int *)(lVar14 + lVar33 * 4) != 4) goto LAB_0035ee66;
            break;
          }
          if (bVar1 == 0) goto LAB_0035f260;
          iVar19 = 1;
          if (bVar1 < 4) {
            iVar19 = *(int *)(lVar14 + lVar33 * 4);
          }
        }
        iVar27 = Ndr_ObjGetRange((Ndr_Data_t *)pData,iVar17,local_58,&local_ac);
        lVar14 = *(long *)((long)pData + 0x10);
        iVar19 = *(int *)(lVar14 + lVar23 * 4) + iVar17;
        uVar21 = 0;
        if (iVar25 < iVar19) {
          piVar8 = (int *)0x0;
          iVar30 = iVar25;
          do {
            lVar33 = (long)iVar30;
            bVar1 = *(byte *)(*(long *)((long)pData + 8) + lVar33);
            if (bVar1 == 4) {
              uVar21 = uVar21 + 1;
              if (piVar8 == (int *)0x0) {
                piVar8 = (int *)(lVar14 + lVar33 * 4);
              }
            }
            else {
              if (bVar1 == 0) goto LAB_0035f260;
              if (piVar8 != (int *)0x0) break;
            }
            iVar32 = 1;
            if (bVar1 < 4) {
              iVar32 = *(int *)(lVar14 + lVar33 * 4);
            }
            iVar30 = iVar30 + iVar32;
          } while (iVar30 < iVar19);
          uVar21 = (uint)(uVar21 == 1);
        }
        else {
          piVar8 = (int *)0x0;
        }
        iVar27 = Wln_ObjAlloc(local_a8,4,iVar27,local_58[0],local_ac);
        pWVar11 = local_a8;
        lVar14 = *(long *)((long)pData + 0x10);
        iVar19 = *(int *)(lVar14 + lVar23 * 4) + iVar17;
        bVar37 = true;
        bVar36 = true;
        if (iVar25 < iVar19) {
          iVar30 = iVar25;
          do {
            lVar33 = (long)iVar30;
            bVar1 = *(byte *)(*(long *)((long)pData + 8) + lVar33);
            if (bVar1 == 5) {
              bVar36 = *(int *)(lVar14 + lVar33 * 4) == -1;
              goto LAB_0035edfc;
            }
            if (bVar1 == 0) goto LAB_0035f260;
            iVar32 = 1;
            if (bVar1 < 4) {
              iVar32 = *(int *)(lVar14 + lVar33 * 4);
            }
            iVar30 = iVar30 + iVar32;
          } while (iVar30 < iVar19);
          bVar36 = true;
        }
LAB_0035edfc:
        if (iVar25 < iVar19) {
          do {
            lVar33 = (long)iVar25;
            bVar1 = *(byte *)(*(long *)((long)pData + 8) + lVar33);
            if (bVar1 == 7) {
              bVar37 = *(int *)(lVar14 + lVar33 * 4) == -1;
              break;
            }
            if (bVar1 == 0) goto LAB_0035f260;
            iVar30 = 1;
            if (bVar1 < 4) {
              iVar30 = *(int *)(lVar14 + lVar33 * 4);
            }
            iVar25 = iVar25 + iVar30;
          } while (iVar25 < iVar19);
        }
        if ((((byte)uVar21 & bVar36) != 1) || (!bVar37)) {
          __assert_fail("nArray == 1 && NameId == -1 && InstId == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnNdr.c"
                        ,0xef,"Wln_Ntk_t *Wln_NtkFromNdr(void *)");
        }
        Wln_ObjAddFanin(local_a8,iVar27,*piVar8);
      }
      else if (cVar2 == '\0') {
LAB_0035f260:
        __assert_fail("p->pHead[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/miniaig/ndr.h"
                      ,0x7e,"int Ndr_DataType(Ndr_Data_t *, int)");
      }
LAB_0035ee66:
      bVar1 = *(byte *)(*(long *)((long)pData + 8) + lVar23);
      if (bVar1 == 0) goto LAB_0035f260;
      iVar25 = 1;
      if (bVar1 < 4) {
        iVar25 = *(int *)(*(long *)((long)pData + 0x10) + lVar23 * 4);
      }
      iVar17 = iVar17 + iVar25;
      lVar14 = *(long *)((long)pData + 0x10);
    } while (iVar17 < *(int *)(lVar14 + 8) + 2);
  }
  pVVar7 = local_78;
  if (local_78->pArray != (int *)0x0) {
    free(local_78->pArray);
    pVVar7->pArray = (int *)0x0;
  }
  free(pVVar7);
  lVar14 = (long)(pWVar11->vInstIds).nSize;
  if (lVar14 < 1) {
LAB_0035eef1:
    piVar8 = (pWVar11->vInstIds).pArray;
    if (piVar8 != (int *)0x0) {
      free(piVar8);
      (pWVar11->vInstIds).pArray = (int *)0x0;
    }
    (pWVar11->vInstIds).nCap = 0;
    (pWVar11->vInstIds).nSize = 0;
  }
  else {
    lVar23 = 0;
    iVar17 = 0;
    do {
      iVar17 = iVar17 + (uint)(0 < (pWVar11->vInstIds).pArray[lVar23]);
      lVar23 = lVar23 + 1;
    } while (lVar14 != lVar23);
    if (iVar17 == 0) goto LAB_0035eef1;
  }
  puVar9 = (uint *)malloc(0x10);
  puVar9[0] = 0;
  puVar9[1] = 0;
  puVar9[2] = 0;
  puVar9[3] = 0;
  uVar21 = (pWVar11->vNameIds).nSize;
  if ((ulong)uVar21 != 0) {
    piVar8 = (pWVar11->vNameIds).pArray;
    iVar17 = *piVar8;
    if (1 < (int)uVar21) {
      uVar18 = 1;
      do {
        if (iVar17 <= piVar8[uVar18]) {
          iVar17 = piVar8[uVar18];
        }
        uVar18 = uVar18 + 1;
      } while (uVar21 != uVar18);
    }
    uVar21 = iVar17 + 1;
    if (-1 < iVar17) {
      pvVar10 = malloc((ulong)uVar21 << 2);
      *(void **)(puVar9 + 2) = pvVar10;
      if (pvVar10 == (void *)0x0) {
LAB_0035f339:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      *puVar9 = uVar21;
      memset(pvVar10,0,(ulong)uVar21 << 2);
    }
    puVar9[1] = uVar21;
    pWVar11 = local_a8;
    if (0 < (local_a8->vNameIds).nSize) {
      lVar14 = 0;
      do {
        uVar21 = piVar8[lVar14];
        if ((ulong)uVar21 != 0) {
          if (((int)uVar21 < 0) || (iVar17 < (int)uVar21)) {
LAB_0035f29e:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *(int *)(*(long *)(puVar9 + 2) + (ulong)uVar21 * 4) = (int)lVar14;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < (local_a8->vNameIds).nSize);
    }
  }
  if (1 < (pWVar11->vTypes).nSize) {
    pWVar5 = pWVar11->vFanins;
    paVar13 = &pWVar5[1].field_2;
    lVar14 = 1;
    do {
      uVar18 = (ulong)(uint)pWVar5[lVar14].nSize;
      if (0 < pWVar5[lVar14].nSize) {
        paVar29 = &pWVar5[lVar14].field_2;
        lVar23 = 0;
        paVar31 = paVar13;
        do {
          paVar22 = paVar31;
          if (2 < (int)uVar18) {
            paVar22 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)(paVar29->pArray[0] + lVar23);
          }
          uVar21 = paVar22->Array[0];
          if ((ulong)uVar21 != 0) {
            if (((int)uVar21 < 0) || ((int)puVar9[1] <= (int)uVar21)) goto LAB_0035f27f;
            paVar22 = paVar29;
            if (2 < (int)uVar18) {
              paVar22 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar29->pArray[0];
            }
            paVar22->Array[lVar23] = *(int *)(*(long *)(puVar9 + 2) + (ulong)uVar21 * 4);
          }
          lVar23 = lVar23 + 1;
          uVar18 = (ulong)pWVar5[lVar14].nSize;
          paVar31 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)((long)paVar31 + 4);
        } while (lVar23 < (long)uVar18);
      }
      lVar14 = lVar14 + 1;
      paVar13 = paVar13 + 2;
    } while (lVar14 < (pWVar11->vTypes).nSize);
  }
  if (*(void **)(puVar9 + 2) != (void *)0x0) {
    free(*(void **)(puVar9 + 2));
    puVar9[2] = 0;
    puVar9[3] = 0;
  }
  if (puVar9 != (uint *)0x0) {
    free(puVar9);
  }
  uVar21 = (pWVar11->vNameIds).nSize;
  if ((ulong)uVar21 == 0) {
    uVar26 = 0;
  }
  else {
    puVar9 = (uint *)(pWVar11->vNameIds).pArray;
    uVar26 = *puVar9;
    if (1 < (int)uVar21) {
      uVar18 = 1;
      do {
        uVar6 = puVar9[uVar18];
        if ((int)uVar26 <= (int)uVar6) {
          uVar26 = uVar6;
        }
        uVar18 = uVar18 + 1;
      } while (uVar21 != uVar18);
    }
  }
  uVar21 = uVar26 + 1;
  uVar18 = (ulong)uVar21;
  if ((1 < uVar21) && (uVar18 = 0, uVar26 != 0)) {
    uVar20 = (ulong)uVar26;
    do {
      uVar6 = (uint)uVar20;
      uVar20 = uVar20 / 10;
      uVar18 = (ulong)((int)uVar18 + 1);
    } while (9 < uVar6);
  }
  pAVar15 = Abc_NamStart(uVar21,10);
  local_a8->pManName = pAVar15;
  if (0 < (int)uVar26) {
    uVar21 = 1;
    do {
      sprintf((char *)local_58,"s%0*d",uVar18,(ulong)uVar21);
      uVar6 = Abc_NamStrFindOrAdd(local_a8->pManName,(char *)local_58,&local_ac);
      if ((local_ac != 0) || (uVar21 != uVar6)) {
        __assert_fail("!fFound && i == NameId",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnNdr.c"
                      ,0x105,"Wln_Ntk_t *Wln_NtkFromNdr(void *)");
      }
      bVar37 = uVar21 != uVar26;
      uVar21 = uVar21 + 1;
    } while (bVar37);
  }
  puVar9 = local_90;
  pWVar11 = local_a8;
  uVar21 = 0;
  if (1 < (local_a8->vTypes).nSize) {
    uVar21 = 0;
    lVar14 = 1;
    do {
      if ((pWVar11->vTypes).pArray[lVar14] == 0x61) {
        if (((int)uVar21 < 0) || ((int)puVar9[1] <= (int)uVar21)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        uVar18 = (ulong)uVar21;
        uVar21 = uVar21 + 1;
        iVar17 = Abc_NamStrFindOrAdd(pWVar11->pManName,
                                     *(char **)(*(long *)(puVar9 + 2) + uVar18 * 8),(int *)0x0);
        Wln_ObjSetConst(pWVar11,(int)lVar14,iVar17);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < (pWVar11->vTypes).nSize);
  }
  if (uVar21 == puVar9[1]) {
    if (*(void **)(puVar9 + 2) != (void *)0x0) {
      free(*(void **)(puVar9 + 2));
      puVar9[2] = 0;
      puVar9[3] = 0;
    }
    free(puVar9);
    Wln_WriteVer(pWVar11,"temp_ndr.v");
    printf("Dumped design \"%s\" into file \"temp_ndr.v\".\n",pWVar11->pName);
    pWVar16 = Wln_NtkDupDfs(pWVar11);
    Wln_NtkFree(pWVar11);
    return pWVar16;
  }
  __assert_fail("i == Vec_PtrSize(vConstStrings)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnNdr.c"
                ,0x10c,"Wln_Ntk_t *Wln_NtkFromNdr(void *)");
  while( true ) {
    if (bVar1 == 0) goto LAB_0035f260;
    iVar27 = 1;
    if (bVar1 < 4) {
      iVar27 = *(int *)(lVar14 + lVar28 * 4);
    }
    uVar26 = uVar26 + iVar27;
    if (iVar25 <= (int)uVar26) break;
LAB_0035e5a1:
    lVar28 = (long)(int)uVar26;
    bVar1 = *(byte *)(lVar23 + lVar28);
    if (bVar1 == 6) {
      if (*(int *)(lVar14 + lVar28 * 4) != 4) {
        iVar27 = Ndr_ObjGetRange((Ndr_Data_t *)pData,iVar17,local_58,&local_ac);
        lVar14 = *(long *)((long)pData + 0x10);
        iVar19 = *(int *)(lVar14 + lVar33 * 4) + iVar17;
        iVar25 = -1;
        if (iVar19 <= (int)uVar21) goto LAB_0035e645;
        uVar26 = uVar21;
        goto LAB_0035e611;
      }
      break;
    }
  }
  goto LAB_0035ec38;
  while( true ) {
    if (bVar1 == 0) goto LAB_0035f260;
    iVar30 = 1;
    if (bVar1 < 4) {
      iVar30 = *(int *)(lVar14 + lVar23 * 4);
    }
    uVar26 = uVar26 + iVar30;
    if (iVar19 <= (int)uVar26) break;
LAB_0035e611:
    lVar23 = (long)(int)uVar26;
    bVar1 = *(byte *)(*(long *)((long)pData + 8) + lVar23);
    if (bVar1 == 6) {
      iVar25 = *(int *)(lVar14 + lVar23 * 4);
      break;
    }
  }
LAB_0035e645:
  local_60 = lVar33;
  if ((int)uVar21 < iVar19) {
    uVar18 = 0;
    uVar20 = 0;
    uVar26 = uVar21;
    do {
      lVar23 = (long)(int)uVar26;
      bVar1 = *(byte *)(*(long *)((long)pData + 8) + lVar23);
      if (bVar1 == 4) {
        uVar20 = (ulong)((int)uVar20 + 1);
        if (uVar18 == 0) {
          uVar18 = lVar14 + lVar23 * 4;
        }
      }
      else {
        if (bVar1 == 0) goto LAB_0035f260;
        if (uVar18 != 0) break;
      }
      iVar30 = 1;
      if (bVar1 < 4) {
        iVar30 = *(int *)(lVar14 + lVar23 * 4);
      }
      uVar26 = uVar26 + iVar30;
    } while ((int)uVar26 < iVar19);
  }
  else {
    uVar18 = 0;
    uVar20 = 0;
  }
  local_6c = local_58[0];
  local_68 = local_ac;
  local_84 = iVar25;
  local_80 = uVar18;
  local_98 = Wln_ObjAlloc(pWVar11,iVar25,iVar27,local_58[0],local_ac);
  pVVar7 = local_78;
  uVar18 = local_80;
  lVar14 = *(long *)((long)pData + 0x10);
  iVar27 = *(int *)(lVar14 + local_60 * 4) + (int)local_60;
  iVar25 = -1;
  if ((int)uVar21 < iVar27) {
    uVar26 = uVar21;
    do {
      lVar23 = (long)(int)uVar26;
      bVar1 = *(byte *)(*(long *)((long)pData + 8) + lVar23);
      if (bVar1 == 5) {
        iVar25 = *(int *)(lVar14 + lVar23 * 4);
        goto LAB_0035e739;
      }
      if (bVar1 == 0) goto LAB_0035f260;
      iVar25 = 1;
      if (bVar1 < 4) {
        iVar25 = *(int *)(lVar14 + lVar23 * 4);
      }
      uVar26 = uVar26 + iVar25;
    } while ((int)uVar26 < iVar27);
    iVar25 = -1;
  }
LAB_0035e739:
  local_9c = uVar21;
  local_64 = iVar25;
  if ((int)uVar21 < iVar27) {
    do {
      lVar23 = (long)(int)uVar21;
      bVar1 = *(byte *)(*(long *)((long)pData + 8) + lVar23);
      if (bVar1 == 7) {
        local_94 = *(int *)(lVar14 + lVar23 * 4);
        goto LAB_0035e78f;
      }
      if (bVar1 == 0) goto LAB_0035f260;
      iVar25 = 1;
      if (bVar1 < 4) {
        iVar25 = *(int *)(lVar14 + lVar23 * 4);
      }
      uVar21 = uVar21 + iVar25;
    } while ((int)uVar21 < iVar27);
  }
  local_94 = -1;
LAB_0035e78f:
  local_78->nSize = 0;
  if (0 < (int)uVar20) {
    uVar24 = 0;
    do {
      Vec_IntPush(pVVar7,*(int *)(uVar18 + uVar24 * 4));
      uVar24 = uVar24 + 1;
    } while (uVar20 != uVar24);
  }
  lVar33 = local_60;
  if (local_84 == 0x58) {
    __assert_fail("Type != ABC_OPER_DFF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnNdr.c"
                  ,0xd6,"Wln_Ntk_t *Wln_NtkFromNdr(void *)");
  }
  if (((int)local_98 < 0) || ((local_a8->vTypes).nSize <= (int)local_98)) {
LAB_0035f27f:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  local_80 = (ulong)local_98;
  iVar25 = (local_a8->vTypes).pArray[local_80];
  if (iVar25 == 0x61) {
    lVar14 = *(long *)((long)pData + 0x10);
    iVar25 = *(int *)(lVar14 + local_60 * 4) + (int)local_60;
    if ((int)local_9c < iVar25) {
      uVar21 = local_9c;
      do {
        lVar23 = (long)(int)uVar21;
        bVar1 = *(byte *)(*(long *)((long)pData + 8) + lVar23);
        if (bVar1 == 9) {
          lVar14 = lVar14 + lVar23 * 4;
          goto LAB_0035e8f4;
        }
        if (bVar1 == 0) goto LAB_0035f260;
        iVar27 = 1;
        if (bVar1 < 4) {
          iVar27 = *(int *)(lVar14 + lVar23 * 4);
        }
        uVar21 = uVar21 + iVar27;
      } while ((int)uVar21 < iVar25);
    }
    lVar14 = 0;
LAB_0035e8f4:
    uVar21 = local_90[1];
    uVar26 = *local_90;
    if (uVar21 == uVar26) {
      if ((int)uVar26 < 0x10) {
        if (*(void **)(local_90 + 2) == (void *)0x0) {
          pvVar10 = malloc(0x80);
        }
        else {
          pvVar10 = realloc(*(void **)(local_90 + 2),0x80);
        }
        uVar6 = 0x10;
      }
      else {
        uVar6 = uVar26 * 2;
        if ((int)uVar6 <= (int)uVar26) goto LAB_0035eb87;
        if (*(void **)(local_90 + 2) == (void *)0x0) {
          pvVar10 = malloc((ulong)uVar26 << 4);
        }
        else {
          pvVar10 = realloc(*(void **)(local_90 + 2),(ulong)uVar26 << 4);
        }
      }
      *(void **)(local_90 + 2) = pvVar10;
      *local_90 = uVar6;
    }
LAB_0035eb87:
    local_90[1] = uVar21 + 1;
    *(long *)(*(long *)(local_90 + 2) + (long)(int)uVar21 * 8) = lVar14;
    pWVar11 = local_a8;
    uVar21 = local_98;
  }
  else {
    pWVar11 = local_a8;
    uVar21 = local_98;
    if (iVar25 == 0x5b) {
      pHVar4 = local_a8->pRanges;
      uVar21 = pHVar4->vObjs->nSize;
      uVar18 = (ulong)uVar21;
      local_9c = uVar21 + 3;
      if (-1 < (int)uVar21) {
        local_9c = uVar21;
      }
      pVVar7 = pHVar4->vTable;
      local_9c = (int)local_9c >> 2;
      if (pVVar7->nSize < (int)local_9c) {
        uVar20 = (ulong)(pVVar7->nSize * 2 - 1);
        while( true ) {
          do {
            uVar21 = (uint)uVar20;
            uVar26 = uVar21 + 1;
            uVar35 = (ulong)uVar26;
            uVar24 = uVar20 & 1;
            uVar20 = uVar35;
          } while (uVar24 != 0);
          if (uVar26 < 9) break;
          iVar25 = 5;
          while (uVar26 % (iVar25 - 2U) != 0) {
            uVar6 = iVar25 * iVar25;
            iVar25 = iVar25 + 2;
            if (uVar26 < uVar6) goto LAB_0035e87d;
          }
        }
LAB_0035e87d:
        local_38 = uVar18;
        if (pVVar7->nCap < (int)uVar26) {
          local_40 = pVVar7;
          if (pVVar7->pArray == (int *)0x0) {
            piVar8 = (int *)malloc((long)(int)uVar26 << 2);
          }
          else {
            piVar8 = (int *)realloc(pVVar7->pArray,(long)(int)uVar26 << 2);
          }
          local_40->pArray = piVar8;
          if (piVar8 == (int *)0x0) goto LAB_0035f339;
          local_40->nCap = uVar26;
          pVVar7 = local_40;
        }
        if (uVar21 < 0x7fffffff) {
          memset(pVVar7->pArray,0,uVar35 << 2);
        }
        pVVar7->nSize = uVar26;
        if (7 < (int)local_38) {
          pVVar7 = pHVar4->vObjs;
          uVar18 = 2;
          if (2 < (int)local_9c) {
            uVar18 = (ulong)local_9c;
          }
          uVar20 = 1;
          do {
            uVar21 = pVVar7->nSize;
            if ((long)(int)uVar21 <= (long)(uVar20 * 4)) goto LAB_0035f2fb;
            piVar8 = pVVar7->pArray;
            piVar8[uVar20 * 4 + 3] = 0;
            uVar26 = pHVar4->vTable->nSize;
            uVar24 = (ulong)(uint)(piVar8[uVar20 * 4 + 1] * 0x1ec1 + piVar8[uVar20 * 4] * 0x1051) %
                     (ulong)uVar26;
            iVar25 = (int)uVar24;
            if ((iVar25 < 0) || ((int)uVar26 <= iVar25)) goto LAB_0035f2fb;
            piVar12 = pHVar4->vTable->pArray + uVar24;
            while( true ) {
              iVar25 = *piVar12;
              if (iVar25 == 0) {
                piVar34 = (int *)0x0;
              }
              else {
                if ((iVar25 < 0) ||
                   (uVar26 = iVar25 * 4,
                   uVar21 == uVar26 || SBORROW4(uVar21,uVar26) != (int)(uVar21 + iVar25 * -4) < 0))
                goto LAB_0035f2fb;
                piVar34 = piVar8 + uVar26;
              }
              if (piVar34 == (int *)0x0) {
                if (iVar25 == 0) goto LAB_0035ea7c;
                goto LAB_0035f377;
              }
              if ((*piVar34 == piVar8[uVar20 * 4]) && (piVar34[1] == piVar8[uVar20 * 4 + 1])) break;
              piVar12 = piVar34 + 3;
            }
            if (iVar25 != 0) {
              __assert_fail("*pPlace == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecHash.h"
                            ,0xac,"int Hash_Int2ManInsert(Hash_IntMan_t *, int, int, int)");
            }
LAB_0035ea7c:
            *piVar12 = (int)uVar20;
            uVar20 = uVar20 + 1;
          } while (uVar20 != uVar18);
        }
      }
      iVar25 = local_68;
      uVar26 = local_9c;
      uVar21 = pHVar4->vTable->nSize;
      uVar18 = (ulong)(uint)(local_68 * 0x1ec1 + local_6c * 0x1051) % (ulong)uVar21;
      iVar27 = (int)uVar18;
      if ((iVar27 < 0) || ((int)uVar21 <= iVar27)) {
LAB_0035f2fb:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      puVar9 = (uint *)(pHVar4->vTable->pArray + uVar18);
      do {
        uVar6 = *puVar9;
        if (uVar6 == 0) {
          piVar8 = (int *)0x0;
        }
        else {
          if ((int)uVar6 < 0) goto LAB_0035f2fb;
          uVar21 = uVar6 * 4;
          uVar3 = pHVar4->vObjs->nSize;
          if (uVar3 == uVar21 || SBORROW4(uVar3,uVar21) != (int)(uVar3 + uVar6 * -4) < 0)
          goto LAB_0035f2fb;
          piVar8 = pHVar4->vObjs->pArray + uVar21;
        }
        if (piVar8 == (int *)0x0) {
          if (uVar6 != 0) {
LAB_0035f377:
            __assert_fail("*pPlace == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecHash.h"
                          ,0x9b,"int *Hash_Int2ManLookup(Hash_IntMan_t *, int, int)");
          }
          goto LAB_0035eb15;
        }
        if ((*piVar8 == local_6c) && (piVar8[1] == local_68)) goto LAB_0035eb4f;
        puVar9 = (uint *)(piVar8 + 3);
      } while( true );
    }
  }
LAB_0035eb9f:
  Wln_ObjAddFanins(pWVar11,uVar21,local_78);
  uVar18 = local_80;
  if ((pWVar11->vNameIds).nSize <= (int)local_98) goto LAB_0035f29e;
  (pWVar11->vNameIds).pArray[local_80] = local_64;
  if (0 < local_94) {
    if ((pWVar11->vInstIds).nSize <= (int)local_98) goto LAB_0035f29e;
    (pWVar11->vInstIds).pArray[local_80] = local_94;
  }
  if (local_84 == 0x35) {
    if (pWVar11->vFanins[local_80].nSize != 2) {
      __assert_fail("Wln_ObjFaninNum(pNtk, iObj) == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnNdr.c"
                    ,0xe2,"Wln_Ntk_t *Wln_NtkFromNdr(void *)");
    }
    Wln_ObjSetSigned(pWVar11,pWVar11->vFanins[local_80].field_2.Array[0]);
    paVar13 = &pWVar11->vFanins[uVar18].field_2;
    if (2 < pWVar11->vFanins[uVar18].nSize) {
      paVar13 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar13->pArray[0];
    }
    Wln_ObjSetSigned(pWVar11,paVar13->Array[1]);
  }
LAB_0035ec38:
  bVar1 = *(byte *)(*(long *)((long)pData + 8) + lVar33);
  if (bVar1 == 0) goto LAB_0035f260;
  iVar25 = 1;
  if (bVar1 < 4) {
    iVar25 = *(int *)(*(long *)((long)pData + 0x10) + lVar33 * 4);
  }
  iVar17 = iVar17 + iVar25;
  lVar14 = *(long *)((long)pData + 0x10);
  if (*(int *)(lVar14 + 8) + 2 <= iVar17) goto LAB_0035ec80;
  goto LAB_0035e522;
LAB_0035eb4f:
  if (uVar6 == 0) {
LAB_0035eb15:
    *puVar9 = local_9c;
    Vec_IntPush(pHVar4->vObjs,local_6c);
    Vec_IntPush(pHVar4->vObjs,iVar25);
    Vec_IntPush(pHVar4->vObjs,0);
    Vec_IntPush(pHVar4->vObjs,0);
    uVar6 = uVar26;
  }
  uVar21 = local_98;
  pWVar11 = local_a8;
  Wln_ObjSetSlice(local_a8,local_98,uVar6);
  goto LAB_0035eb9f;
}

Assistant:

Wln_Ntk_t * Wln_NtkFromNdr( void * pData )
{
    Ndr_Data_t * p = (Ndr_Data_t *)pData;  
    Vec_Int_t * vName2Obj, * vFanins = Vec_IntAlloc( 100 );
    Vec_Ptr_t * vConstStrings = Vec_PtrAlloc( 100 );
    int Mod = 2, i, k, iFanin, iObj, Obj, * pArray, nDigits, fFound, NameId, NameIdMax;
    Wln_Ntk_t * pTemp, * pNtk = Wln_NtkAlloc( "top", Ndr_DataObjNum(p, Mod) );
    Wln_NtkCheckIntegrity( pData );
    //pNtk->pSpec = Abc_UtilStrsav( pFileName );
    // construct network and save name IDs
    Wln_NtkCleanNameId( pNtk );
    Wln_NtkCleanInstId( pNtk );
    Ndr_ModForEachPi( p, Mod, Obj )
    {
        int End, Beg, Signed = Ndr_ObjGetRange(p, Obj, &End, &Beg);
        int iObj = Wln_ObjAlloc( pNtk, ABC_OPER_CI, Signed, End, Beg );
        int NameId = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        int InstId = Ndr_ObjReadBody( p, Obj, NDR_NAME );
        Wln_ObjSetNameId( pNtk, iObj, NameId );
        if ( InstId > 0 ) Wln_ObjSetInstId( pNtk, iObj, InstId );
    }
    Ndr_ModForEachNode( p, Mod, Obj )
    {
        int End, Beg, Signed = Ndr_ObjGetRange(p, Obj, &End, &Beg);
        int Type    = Ndr_ObjReadBody( p, Obj, NDR_OPERTYPE );
        int nArray  = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        Vec_Int_t F = {nArray, nArray, pArray}, * vTemp = &F;
        int iObj    = Wln_ObjAlloc( pNtk, Type, Signed, End, Beg );
        int NameId  = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        int InstId  = Ndr_ObjReadBody( p, Obj, NDR_NAME );
        Vec_IntClear( vFanins );
        Vec_IntAppend( vFanins, vTemp );
        assert( Type != ABC_OPER_DFF );
        if ( Wln_ObjIsSlice(pNtk, iObj) )
            Wln_ObjSetSlice( pNtk, iObj, Hash_Int2ManInsert(pNtk->pRanges, End, Beg, 0) );
        else if ( Wln_ObjIsConst(pNtk, iObj) )
            Vec_PtrPush( vConstStrings, (char *)Ndr_ObjReadBodyP(p, Obj, NDR_FUNCTION) );
//        else if ( Type == ABC_OPER_BIT_MUX && Vec_IntSize(vFanins) == 3 )
//            ABC_SWAP( int, Wln_ObjFanins(pNtk, iObj)[1], Wln_ObjFanins(pNtk, iObj)[2] );
        Wln_ObjAddFanins( pNtk, iObj, vFanins );
        Wln_ObjSetNameId( pNtk, iObj, NameId );
        if ( InstId > 0 ) Wln_ObjSetInstId( pNtk, iObj, InstId );
        if ( Type == ABC_OPER_ARI_SMUL )
        {
            assert( Wln_ObjFaninNum(pNtk, iObj) == 2 );
            Wln_ObjSetSigned( pNtk, Wln_ObjFanin0(pNtk, iObj) );
            Wln_ObjSetSigned( pNtk, Wln_ObjFanin1(pNtk, iObj) );
        }
    }
    // mark primary outputs
    Ndr_ModForEachPo( p, Mod, Obj )
    {
        int End, Beg, Signed = Ndr_ObjGetRange(p, Obj, &End, &Beg);
        int nArray  = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        int iObj    = Wln_ObjAlloc( pNtk, ABC_OPER_CO, Signed, End, Beg );
        int NameId  = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        int InstId  = Ndr_ObjReadBody( p, Obj, NDR_NAME );
        assert( nArray == 1 && NameId == -1 && InstId == -1 );
        Wln_ObjAddFanin( pNtk, iObj, pArray[0] );
    }
    Vec_IntFree( vFanins );
    // remove instance names if they are not given
    //Vec_IntPrint( &pNtk->vInstIds );
    if ( Vec_IntCountPositive(&pNtk->vInstIds) == 0 )
        Vec_IntErase( &pNtk->vInstIds );
    // map name IDs into object IDs
    vName2Obj = Vec_IntInvert( &pNtk->vNameIds, 0 );
    Wln_NtkForEachObj( pNtk, i )
        Wln_ObjForEachFanin( pNtk, i, iFanin, k )
            Wln_ObjSetFanin( pNtk, i, k, Vec_IntEntry(vName2Obj, iFanin) );
    Vec_IntFree(vName2Obj);
    // create fake object names
    NameIdMax = Vec_IntFindMax(&pNtk->vNameIds);
    nDigits = Abc_Base10Log( NameIdMax+1 );
    pNtk->pManName = Abc_NamStart( NameIdMax+1, 10 );
    for ( i = 1; i <= NameIdMax; i++ )
    {
        char pName[20]; sprintf( pName, "s%0*d", nDigits, i );
        NameId = Abc_NamStrFindOrAdd( pNtk->pManName, pName, &fFound );
        assert( !fFound && i == NameId );
    }
    // add const strings
    i = 0;
    Wln_NtkForEachObj( pNtk, iObj )
        if ( Wln_ObjIsConst(pNtk, iObj) )
            Wln_ObjSetConst( pNtk, iObj, Abc_NamStrFindOrAdd(pNtk->pManName, (char *)Vec_PtrEntry(vConstStrings, i++), NULL) );
    assert( i == Vec_PtrSize(vConstStrings) );
    Vec_PtrFree( vConstStrings );
    //Ndr_NtkPrintObjects( pNtk );
    Wln_WriteVer( pNtk, "temp_ndr.v" );
    printf( "Dumped design \"%s\" into file \"temp_ndr.v\".\n", pNtk->pName );
    // derive topological order
    pNtk = Wln_NtkDupDfs( pTemp = pNtk );
    Wln_NtkFree( pTemp );
    //Ndr_NtkPrintObjects( pNtk );
    //pNtk->fMemPorts = 1;          // the network contains memory ports
    //pNtk->fEasyFfs = 1;           // the network contains simple flops
    return pNtk;
}